

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::GetUByte(FieldDef *field,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  
  local_20 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return string\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  ConvertCase(&local_f0,code_ptr_local,kUpperCamel,kSnake);
  std::operator+(&local_d0,&local_f0,"Bytes()\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_130,&local_150,"return $this->__vector_as_bytes(");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  NumToString<unsigned_short>(&local_190,(unsigned_short)code_ptr_local[8]._M_string_length);
  std::operator+(&local_170,&local_190,");\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::operator+(&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

static void GetUByte(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @return string\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel) + "Bytes()\n";
    code += Indent + "{\n";
    code += Indent + Indent + "return $this->__vector_as_bytes(";
    code += NumToString(field.value.offset) + ");\n";
    code += Indent + "}\n\n";
  }